

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O1

void __thiscall QTextStream::QTextStream(QTextStream *this,QIODevice *device)

{
  _Head_base<0UL,_QTextStreamPrivate_*,_false> this_00;
  QTextStreamPrivate *d;
  
  this_00._M_head_impl = (QTextStreamPrivate *)operator_new(0x150);
  QTextStreamPrivate::QTextStreamPrivate(this_00._M_head_impl,this);
  (this->d_ptr)._M_t.
  super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
  super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
  super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl = this_00._M_head_impl;
  (this_00._M_head_impl)->device = device;
  (this_00._M_head_impl)->status = Ok;
  return;
}

Assistant:

QTextStream::QTextStream(QIODevice *device)
    : d_ptr(new QTextStreamPrivate(this))
{
#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStream::QTextStream(QIODevice *device == *%p)",
           device);
#endif
    Q_D(QTextStream);
    d->device = device;
#ifndef QT_NO_QOBJECT
    d->deviceClosedNotifier.setupDevice(this, d->device);
#endif
    d->status = Ok;
}